

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_interactor.cpp
# Opt level: O3

void Am_Animation_Stop_Method_proc
               (Am_Object *inter,Am_Object *object,Am_Object *event_window,Am_Input_Event *ev)

{
  int x;
  int y;
  Am_Input_Char ic;
  Am_Input_Event *pAVar1;
  Am_Value *pAVar2;
  Am_Object text;
  Am_Object command_obj;
  Am_Object local_88;
  Am_Object local_80;
  Am_Object local_78;
  Am_Object *local_70;
  Am_Input_Event *local_68;
  Am_Inter_Location local_60;
  Am_Object local_58;
  Am_Object *local_50;
  Am_Inter_Internal_Method inter_method;
  
  command_obj.data = (Am_Object_Data *)0x0;
  text.data = (Am_Object_Data *)0x0;
  local_70 = event_window;
  local_68 = ev;
  local_50 = object;
  pAVar2 = Am_Object::Get(inter,0xc5,0);
  Am_Object::operator=(&command_obj,pAVar2);
  pAVar2 = Am_Object::Get(inter,0x11a,0);
  Am_Object::operator=(&text,pAVar2);
  Am_Object::Am_Object(&local_78,inter);
  Am_Object::Am_Object(&local_80,&command_obj);
  pAVar1 = local_68;
  x = local_68->x;
  y = local_68->y;
  Am_Object::Am_Object(&local_88,local_70);
  ic = pAVar1->input_char;
  Am_Object::Am_Object(&local_58,&text);
  Am_Inter_Location::Am_Inter_Location(&local_60,&Am_No_Location);
  Am_Call_Final_Do_And_Register
            (&local_78,&local_80,x,y,&local_88,ic,(Am_Object_Data *)&local_58,
             (Am_Inter_Location_Data *)&local_60,(Am_Impl_Command_Setter *)0x0);
  Am_Inter_Location::~Am_Inter_Location(&local_60);
  Am_Object::~Am_Object(&local_58);
  Am_Object::~Am_Object(&local_88);
  Am_Object::~Am_Object(&local_80);
  Am_Object::~Am_Object(&local_78);
  inter_method.from_wrapper = (Am_Method_Wrapper *)0x0;
  inter_method.Call = (Am_Inter_Internal_Method_Type *)0x0;
  pAVar2 = Am_Object::Get(&Am_Interactor,0xc2,0);
  Am_Inter_Internal_Method::operator=(&inter_method,pAVar2);
  (*inter_method.Call)(inter,local_50,local_70,local_68);
  Am_Object::~Am_Object(&text);
  Am_Object::~Am_Object(&command_obj);
  return;
}

Assistant:

Am_Define_Method(Am_Inter_Internal_Method, void, Am_Animation_Stop_Method,
                 (Am_Object & inter, Am_Object &object, Am_Object &event_window,
                  Am_Input_Event *ev))
{
  Am_INTER_TRACE_PRINT(inter, "Animation stopping " << object);

  Am_Object command_obj, text;
  command_obj = inter.Get(Am_COMMAND);
  text = inter.Get(Am_START_OBJECT);
  // now call stop
  Am_Call_Final_Do_And_Register(inter, command_obj, ev->x, ev->y, event_window,
                                ev->input_char, text, Am_No_Location,
                                nullptr); //no impl_setter since no undo

  // LAST, call the prototype's method
  Am_Inter_Internal_Method inter_method;
  inter_method = Am_Interactor.Get(Am_INTER_STOP_METHOD);
  inter_method.Call(inter, object, event_window, ev);
}